

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_source_delay.cc
# Opt level: O2

void __thiscall
sptk::InputSourceDelay::InputSourceDelay
          (InputSourceDelay *this,int delay,bool keep_sequence_length,InputSourceInterface *source)

{
  int iVar1;
  int iVar2;
  vector<double,_std::allocator<double>_> data;
  _Vector_base<double,_std::allocator<double>_> local_38;
  
  (this->super_InputSourceInterface)._vptr_InputSourceInterface =
       (_func_int **)&PTR__InputSourceDelay_00110c50;
  this->delay_ = delay;
  this->keep_sequence_length_ = keep_sequence_length;
  this->source_ = source;
  this->is_valid_ = true;
  std::
  queue<std::vector<double,std::allocator<double>>,std::deque<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>
  ::
  queue<std::deque<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>,void>
            (&this->queue_);
  if ((this->source_ != (InputSourceInterface *)0x0) &&
     (iVar1 = (*this->source_->_vptr_InputSourceInterface[3])(), (char)iVar1 != '\0')) {
    local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    iVar1 = this->delay_;
    if (iVar1 < 1) {
      iVar1 = 0;
      while ((this->num_zeros_ = iVar1, SBORROW4(iVar1,-delay) != iVar1 + delay < 0 &&
             (iVar1 = (*this->source_->_vptr_InputSourceInterface[4])(this->source_,&local_38),
             (char)iVar1 != '\0'))) {
        iVar1 = this->num_zeros_ + 1;
      }
    }
    else {
      iVar2 = 0;
      while ((this->num_zeros_ = iVar2, iVar2 < iVar1 &&
             (iVar1 = (*this->source_->_vptr_InputSourceInterface[4])(this->source_,&local_38),
             (char)iVar1 != '\0'))) {
        std::
        deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::push_back(&(this->queue_).c,(value_type *)&local_38);
        iVar1 = this->delay_;
        iVar2 = this->num_zeros_ + 1;
      }
      if (this->keep_sequence_length_ == false) {
        this->num_zeros_ = this->delay_;
      }
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_38);
    return;
  }
  this->is_valid_ = false;
  return;
}

Assistant:

InputSourceDelay::InputSourceDelay(int delay, bool keep_sequence_length,
                                   InputSourceInterface* source)
    : delay_(delay),
      keep_sequence_length_(keep_sequence_length),
      source_(source),
      is_valid_(true) {
  if (NULL == source_ || !source_->IsValid()) {
    is_valid_ = false;
    return;
  }

  std::vector<double> data;
  if (delay_ <= 0) {
    // Skip data.
    for (num_zeros_ = 0; num_zeros_ < -delay; ++num_zeros_) {
      if (!source_->Get(&data)) {
        break;
      }
    }
  } else {
    // Store data.
    for (num_zeros_ = 0; num_zeros_ < delay_; ++num_zeros_) {
      if (!source_->Get(&data)) {
        break;
      }
      queue_.push(data);
    }
    if (!keep_sequence_length_) {
      num_zeros_ = delay_;
    }
  }
}